

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O1

t_symbol * sys_decodedialog(t_symbol *s)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  t_symbol *ptVar4;
  char *pcVar5;
  char *pcVar6;
  char buf [1000];
  char local_3f8 [1008];
  
  pcVar5 = s->s_name;
  if (*pcVar5 == '+') {
    pcVar5 = pcVar5 + 1;
  }
  else {
    bug("sys_decodedialog: %s",pcVar5);
  }
  uVar3 = 0;
  do {
    cVar1 = *pcVar5;
    if (cVar1 == '+') {
      pcVar6 = pcVar5 + 1;
      bVar2 = pcVar5[1];
      if (bVar2 < 99) {
        if (bVar2 == 0x2b) {
          local_3f8[uVar3] = '+';
        }
        else {
          if (bVar2 != 0x5f) goto LAB_0017702c;
          local_3f8[uVar3] = ' ';
        }
      }
      else if (bVar2 == 99) {
        local_3f8[uVar3] = ',';
      }
      else if (bVar2 == 100) {
        local_3f8[uVar3] = '$';
      }
      else {
        if (bVar2 != 0x73) goto LAB_0017702c;
        local_3f8[uVar3] = ';';
      }
    }
    else {
      if (cVar1 == '\0') goto LAB_00177089;
LAB_0017702c:
      local_3f8[uVar3] = cVar1;
      pcVar6 = pcVar5;
    }
    uVar3 = uVar3 + 1;
    pcVar5 = pcVar6 + 1;
  } while (uVar3 != 999);
  uVar3 = 999;
LAB_00177089:
  local_3f8[uVar3 & 0xffffffff] = '\0';
  ptVar4 = gensym(local_3f8);
  return ptVar4;
}

Assistant:

t_symbol *sys_decodedialog(t_symbol *s)
{
    char buf[MAXPDSTRING];
    const char *sp = s->s_name;
    int i;
    if (*sp != '+')
        bug("sys_decodedialog: %s", sp);
    else sp++;
    for (i = 0; i < MAXPDSTRING-1; i++, sp++)
    {
        if (!sp[0])
            break;
        if (sp[0] == '+')
        {
            if (sp[1] == '_')
                buf[i] = ' ', sp++;
            else if (sp[1] == '+')
                buf[i] = '+', sp++;
            else if (sp[1] == 'c')
                buf[i] = ',', sp++;
            else if (sp[1] == 's')
                buf[i] = ';', sp++;
            else if (sp[1] == 'd')
                buf[i] = '$', sp++;
            else buf[i] = sp[0];
        }
        else buf[i] = sp[0];
    }
    buf[i] = 0;
    return (gensym(buf));
}